

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O0

vec2f json2vec2f(Json *o)

{
  bool bVar1;
  value_t vVar2;
  undefined8 *puVar3;
  size_type sVar4;
  reference pvVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  float fVar6;
  vector<float,_std::allocator<float>_> a;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffffb8;
  Json *in_stack_ffffffffffffffc0;
  vector<float,_std::allocator<float>_> *this;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd0;
  vector<float,_std::allocator<float>_> local_28;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_10;
  vec2f local_8;
  
  local_10 = in_RDI;
  bVar1 = is_number(in_stack_ffffffffffffffc0);
  if (bVar1) {
    fVar6 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_float<float,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x18c223);
    vec2f::vec2f(&local_8,fVar6);
  }
  else {
    vVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::type(local_10);
    if (vVar2 != array) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "failed convert json to vec2f";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_vector<std::vector<float,_std::allocator<float>_>,_0>(in_stack_ffffffffffffffb8);
    sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_28);
    if (sVar4 != 2) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "vector size mismatched";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    this = &local_28;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this,0);
    fVar6 = *pvVar5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this,1);
    vec2f::vec2f(&local_8,fVar6,*pvVar5);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

vec2f json2vec2f(const Json& o) {
	if (is_number(o))
		return vec2f(o);
	if (o.type() != Json::value_t::array)
		throw "failed convert json to vec2f";
	std::vector<float> a = o;
	if (a.size()!=2) throw "vector size mismatched";
	return vec2f(a[0], a[1]);
}